

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::ExpectFileContent
          (CommandLineInterfaceTester *this,string_view filename,string_view content)

{
  size_t sVar1;
  Nonnull<const_char_*> failure_msg;
  char *message;
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  AssertionResult gtest_ar;
  AlphaNum local_e0;
  AlphaNum local_b0;
  string file_contents;
  string path;
  
  file_contents._M_string_length = (size_type)(this->temp_directory_)._M_dataplus._M_p;
  file_contents._M_dataplus._M_p = (pointer)(this->temp_directory_)._M_string_length;
  local_e0.piece_ = absl::lts_20250127::NullSafeStringView("/");
  local_b0.piece_._M_len = filename._M_len;
  local_b0.piece_._M_str = filename._M_str;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&path,(lts_20250127 *)&file_contents,&local_e0,&local_b0,&local_e0);
  file_contents._M_dataplus._M_p = (pointer)&file_contents.field_2;
  file_contents._M_string_length = 0;
  file_contents.field_2._M_local_buf[0] = '\0';
  File::ReadFileToString((File *)&local_e0,&path,&file_contents,false);
  sVar1 = local_e0.piece_._M_len;
  if (local_e0.piece_._M_len == 1) {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  else {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)&local_e0,
                             "File::GetContents(path, &file_contents, true) is OK");
  }
  absl::lts_20250127::Status::~Status((Status *)&local_e0);
  if (sVar1 == 1) {
    std::
    pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::
    pair<const_char_(&)[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)&local_b0,(char (*) [8])0xe82ec4,&this->temp_directory_);
    s._M_str = (char *)&local_b0;
    s._M_len = (size_t)content._M_str;
    replacements._M_len = in_R9;
    replacements._M_array = (iterator)0x1;
    absl::lts_20250127::StrReplaceAll_abi_cxx11_
              ((string *)&local_e0,(lts_20250127 *)content._M_len,s,replacements);
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar,
               "absl::StrReplaceAll(content, {{\"$tmpdir\", temp_directory_}})","file_contents",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
               &file_contents);
    std::__cxx11::string::~string((string *)&local_e0);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_e0);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = anon_var_dwarf_651463 + 5;
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
                 ,0xb8,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
      if ((long *)local_e0.piece_._M_len != (long *)0x0) {
        (**(code **)(*(long *)local_e0.piece_._M_len + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    std::__cxx11::string::~string((string *)&file_contents);
    std::__cxx11::string::~string((string *)&path);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
             ,0xb5,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_e0);
}

Assistant:

void CommandLineInterfaceTester::ExpectFileContent(absl::string_view filename,
                                                   absl::string_view content) {
  std::string path = absl::StrCat(temp_directory_, "/", filename);
  std::string file_contents;
  ABSL_CHECK_OK(File::GetContents(path, &file_contents, true));

  EXPECT_EQ(absl::StrReplaceAll(content, {{"$tmpdir", temp_directory_}}),
            file_contents);
}